

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b9e812::AV1ResolutionChange_InvalidInputSize_Test::TestBody
          (AV1ResolutionChange_InvalidInputSize_Test *this)

{
  bool bVar1;
  pointer ctx_00;
  long in_RDI;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  int i;
  aom_codec_cx_pkt_t *pkt;
  aom_codec_iter_t iter;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  value_type *frame_size;
  const_iterator __end1;
  const_iterator __begin1;
  array<FrameSize,_3UL> *__range1;
  int kNumFramesPerResolution;
  RandomVideoSource video;
  int frame_count;
  AssertionResult gtest_ar_2;
  unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> enc;
  AssertionResult gtest_ar_1;
  aom_codec_ctx_t ctx;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_iface_t *iface;
  pointer in_stack_fffffffffffff968;
  RandomVideoSource *in_stack_fffffffffffff970;
  aom_codec_enc_cfg_t *in_stack_fffffffffffff978;
  aom_codec_iface_t *in_stack_fffffffffffff980;
  aom_codec_iter_t *in_stack_fffffffffffff988;
  int line;
  aom_codec_enc_cfg_t *in_stack_fffffffffffff990;
  aom_image_t *in_stack_fffffffffffff998;
  Type type;
  aom_codec_ctx_t *in_stack_fffffffffffff9a0;
  Message *in_stack_fffffffffffff9e8;
  AssertHelper *in_stack_fffffffffffff9f0;
  AssertHelper *this_00;
  AssertionResult local_5a8 [2];
  undefined4 local_584;
  AssertionResult local_580 [2];
  undefined4 local_560;
  aom_codec_err_t local_55c;
  AssertionResult local_558;
  int local_544;
  aom_codec_enc_cfg_t *local_540;
  undefined8 local_538;
  undefined4 local_520;
  aom_codec_err_t local_51c;
  AssertionResult local_518 [2];
  undefined4 local_4f8;
  aom_codec_err_t local_4f4;
  AssertionResult local_4f0;
  const_iterator local_4e0;
  const_iterator local_4d8;
  const_iterator local_4d0;
  array<FrameSize,_3UL> *local_4c8;
  undefined4 local_4bc;
  aom_codec_ctx_t local_4b8;
  int local_47c;
  undefined4 local_468;
  aom_codec_err_t local_464;
  AssertionResult local_460;
  code *local_450;
  AssertHelper local_448 [4];
  undefined4 local_428;
  aom_codec_err_t local_424;
  AssertionResult local_420 [4];
  uint local_3d4;
  undefined4 local_3b0;
  aom_codec_err_t local_3ac;
  AssertionResult local_3a8;
  uint local_38c;
  uint local_388;
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_338;
  aom_codec_iface_t *local_10;
  
  local_10 = aom_codec_av1_cx();
  local_3ac = aom_codec_enc_config_default
                        (in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                         (uint)((ulong)in_stack_fffffffffffff970 >> 0x20));
  local_3b0 = 0;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
             &in_stack_fffffffffffff978->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff970);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x87ec80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff9a0,
               (Type)((ulong)in_stack_fffffffffffff998 >> 0x20),(char *)in_stack_fffffffffffff990,
               (int)((ulong)in_stack_fffffffffffff988 >> 0x20),(char *)in_stack_fffffffffffff980);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff970);
    testing::Message::~Message((Message *)0x87ece3);
  }
  local_3d4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x87ed6a);
  if (local_3d4 == 0) {
    local_364 = 0;
    local_360 = 0;
    local_338 = *(undefined4 *)(in_RDI + 0x1c);
    local_424 = aom_codec_enc_init_ver
                          (in_stack_fffffffffffff9a0,(aom_codec_iface_t *)in_stack_fffffffffffff998,
                           in_stack_fffffffffffff990,(aom_codec_flags_t)in_stack_fffffffffffff988,
                           (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
    local_428 = 0;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               &in_stack_fffffffffffff978->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff970);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_420);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9a0);
      testing::AssertionResult::failure_message((AssertionResult *)0x87ee4e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9a0,
                 (Type)((ulong)in_stack_fffffffffffff998 >> 0x20),(char *)in_stack_fffffffffffff990,
                 (int)((ulong)in_stack_fffffffffffff988 >> 0x20),(char *)in_stack_fffffffffffff980);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff970);
      testing::Message::~Message((Message *)0x87eeb1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x87ef22);
    local_450 = aom_codec_destroy;
    this_00 = local_448;
    std::unique_ptr<aom_codec_ctx,aom_codec_err_t(*)(aom_codec_ctx*)>::
    unique_ptr<aom_codec_err_t(*)(aom_codec_ctx*),void>
              ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
               in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               (__enable_if_t<_is_lvalue_reference<aom_codec_err_t_(*)(aom_codec_ctx_*)>::value,_aom_codec_err_t_(*&&)(aom_codec_ctx_*)>
                )0x87ef56);
    ctx_00 = std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::get
                       ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
                        in_stack_fffffffffffff970);
    local_464 = aom_codec_control(ctx_00,0xd,(ulong)*(uint *)(in_RDI + 0x20));
    local_468 = 0;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               &in_stack_fffffffffffff978->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff970);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_460);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9a0);
      in_stack_fffffffffffff9e8 =
           (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x87f02b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9a0,
                 (Type)((ulong)in_stack_fffffffffffff998 >> 0x20),(char *)in_stack_fffffffffffff990,
                 (int)((ulong)in_stack_fffffffffffff988 >> 0x20),(char *)in_stack_fffffffffffff980);
      testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffff9e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff970);
      testing::Message::~Message((Message *)0x87f08e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x87f0ff);
    local_47c = 0;
    libaom_test::ACMRandom::DeterministicSeed();
    libaom_test::RandomVideoSource::RandomVideoSource
              ((RandomVideoSource *)in_stack_fffffffffffff980,
               (int)((ulong)in_stack_fffffffffffff978 >> 0x20));
    libaom_test::RandomVideoSource::Begin(in_stack_fffffffffffff970);
    local_4bc = 2;
    local_4c8 = &TestBody::kFrameSizes;
    local_4d0 = std::array<FrameSize,_3UL>::begin((array<FrameSize,_3UL> *)0x87f155);
    local_4d8 = std::array<FrameSize,_3UL>::end((array<FrameSize,_3UL> *)0x87f169);
    for (; local_4d0 != local_4d8; local_4d0 = local_4d0 + 1) {
      local_4e0 = local_4d0;
      local_38c = local_4d0->width;
      local_388 = local_4d0->height;
      if ((((local_38c == 0) || (0x10000 < local_38c)) || (local_388 == 0)) || (0x10000 < local_388)
         ) {
        std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::get
                  ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
                   in_stack_fffffffffffff970);
        local_4f4 = aom_codec_enc_config_set
                              ((aom_codec_ctx_t *)in_stack_fffffffffffff980,
                               in_stack_fffffffffffff978);
        local_4f8 = 8;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  ((char *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
                   &in_stack_fffffffffffff978->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff970)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff9a0);
          testing::AssertionResult::failure_message((AssertionResult *)0x87f2b1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff9a0,
                     (Type)((ulong)in_stack_fffffffffffff998 >> 0x20),
                     (char *)in_stack_fffffffffffff990,
                     (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                     (char *)in_stack_fffffffffffff980);
          testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffff9e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff970);
          testing::Message::~Message((Message *)0x87f30e);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x87f379);
      }
      else {
        std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::get
                  ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
                   in_stack_fffffffffffff970);
        local_51c = aom_codec_enc_config_set
                              ((aom_codec_ctx_t *)in_stack_fffffffffffff980,
                               in_stack_fffffffffffff978);
        local_520 = 0;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  ((char *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
                   &in_stack_fffffffffffff978->g_usage,(aom_codec_err_t *)in_stack_fffffffffffff970)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_518);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff9a0);
          testing::AssertionResult::failure_message((AssertionResult *)0x87f42a);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff9a0,
                     (Type)((ulong)in_stack_fffffffffffff998 >> 0x20),
                     (char *)in_stack_fffffffffffff990,
                     (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                     (char *)in_stack_fffffffffffff980);
          testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffff9e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff970);
          testing::Message::~Message((Message *)0x87f487);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x87f4f8);
        libaom_test::DummyVideoSource::SetSize
                  (&in_stack_fffffffffffff970->super_DummyVideoSource,
                   (uint)((ulong)in_stack_fffffffffffff968 >> 0x20),(uint)in_stack_fffffffffffff968)
        ;
        for (local_544 = 0; local_544 < 2; local_544 = local_544 + 1) {
          libaom_test::DummyVideoSource::Next((DummyVideoSource *)0x87f53b);
          std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::get
                    ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
                     in_stack_fffffffffffff970);
          in_stack_fffffffffffff9a0 = &local_4b8;
          libaom_test::DummyVideoSource::img((DummyVideoSource *)in_stack_fffffffffffff9a0);
          libaom_test::DummyVideoSource::pts((DummyVideoSource *)in_stack_fffffffffffff9a0);
          libaom_test::DummyVideoSource::duration((DummyVideoSource *)in_stack_fffffffffffff9a0);
          local_55c = aom_codec_encode(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                                       (aom_codec_pts_t)in_stack_fffffffffffff990,
                                       (unsigned_long)in_stack_fffffffffffff988,
                                       (aom_enc_frame_flags_t)in_stack_fffffffffffff980);
          local_560 = 0;
          testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                    ((char *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
                     &in_stack_fffffffffffff978->g_usage,
                     (aom_codec_err_t *)in_stack_fffffffffffff970);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_558);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffff9a0);
            in_stack_fffffffffffff998 =
                 (aom_image_t *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x87f62a);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff9a0,
                       (Type)((ulong)in_stack_fffffffffffff998 >> 0x20),
                       (char *)in_stack_fffffffffffff990,
                       (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                       (char *)in_stack_fffffffffffff980);
            testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffff9e8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff970);
            testing::Message::~Message((Message *)0x87f687);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x87f6f8);
          local_538 = 0;
          while( true ) {
            std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::get
                      ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
                       in_stack_fffffffffffff970);
            in_stack_fffffffffffff990 =
                 (aom_codec_enc_cfg_t *)
                 aom_codec_get_cx_data
                           ((aom_codec_ctx_t *)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
            local_540 = in_stack_fffffffffffff990;
            if (in_stack_fffffffffffff990 == (aom_codec_enc_cfg_t *)0x0) break;
            local_584 = 0;
            testing::internal::EqHelper::
            Compare<aom_codec_cx_pkt_kind,_aom_codec_cx_pkt_kind,_nullptr>
                      ((char *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
                       &in_stack_fffffffffffff978->g_usage,
                       (aom_codec_cx_pkt_kind *)in_stack_fffffffffffff970);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_580);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffff9a0);
              in_stack_fffffffffffff988 =
                   (aom_codec_iter_t *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x87f7bd);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff9a0,
                         (Type)((ulong)in_stack_fffffffffffff998 >> 0x20),
                         (char *)in_stack_fffffffffffff990,
                         (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                         (char *)in_stack_fffffffffffff980);
              testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffff9e8);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff970);
              testing::Message::~Message((Message *)0x87f81a);
            }
            local_3d4 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x87f8a1);
            if (local_3d4 != 0) goto LAB_0087fbf7;
            if ((local_544 == 0) || (*(int *)(in_RDI + 0x18) == 2)) {
              testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                        ((char *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
                         &in_stack_fffffffffffff978->g_usage,(uint *)in_stack_fffffffffffff970);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5a8);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffff9a0);
                in_stack_fffffffffffff980 =
                     (aom_codec_iface_t *)
                     testing::Message::operator<<
                               ((Message *)in_stack_fffffffffffff970,
                                (char (*) [7])in_stack_fffffffffffff968);
                in_stack_fffffffffffff978 =
                     (aom_codec_enc_cfg_t *)
                     testing::Message::operator<<
                               ((Message *)in_stack_fffffffffffff970,
                                (int *)in_stack_fffffffffffff968);
                in_stack_fffffffffffff970 =
                     (RandomVideoSource *)
                     testing::AssertionResult::failure_message((AssertionResult *)0x87f995);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff9a0,
                           (Type)((ulong)in_stack_fffffffffffff998 >> 0x20),
                           (char *)in_stack_fffffffffffff990,
                           (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                           (char *)in_stack_fffffffffffff980);
                testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffff9e8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffff970);
                testing::Message::~Message((Message *)0x87f9ef);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x87fa5a);
            }
            local_47c = local_47c + 1;
          }
        }
      }
    }
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               (int *)in_stack_fffffffffffff978,(int *)in_stack_fffffffffffff970);
    type = (Type)((ulong)in_stack_fffffffffffff998 >> 0x20);
    line = (int)((ulong)in_stack_fffffffffffff988 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffa30);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9a0);
      testing::AssertionResult::failure_message((AssertionResult *)0x87fb23);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9a0,type,(char *)in_stack_fffffffffffff990,
                 line,(char *)in_stack_fffffffffffff980);
      testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffff9e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff970);
      testing::Message::~Message((Message *)0x87fb7e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x87fbec);
    local_3d4 = 0;
LAB_0087fbf7:
    libaom_test::RandomVideoSource::~RandomVideoSource((RandomVideoSource *)0x87fc04);
    std::unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)>::~unique_ptr
              ((unique_ptr<aom_codec_ctx,_aom_codec_err_t_(*)(aom_codec_ctx_*)> *)
               in_stack_fffffffffffff980);
  }
  return;
}

Assistant:

TEST_P(AV1ResolutionChange, InvalidInputSize) {
  struct FrameSize {
    unsigned int width;
    unsigned int height;
  };
  static constexpr std::array<FrameSize, 3> kFrameSizes = { {
      { 1768, 0 },
      { 0, 200 },
      { 850, 200 },
  } };

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, usage_), AOM_CODEC_OK);

  // Resolution changes are only permitted with one pass encoding with no lag.
  cfg.g_pass = AOM_RC_ONE_PASS;
  cfg.g_lag_in_frames = 0;
  cfg.rc_end_usage = rc_mode_;

  aom_codec_ctx_t ctx;
  EXPECT_EQ(aom_codec_enc_init(&ctx, iface, &cfg, 0), AOM_CODEC_OK);
  std::unique_ptr<aom_codec_ctx_t, decltype(&aom_codec_destroy)> enc(
      &ctx, &aom_codec_destroy);
  EXPECT_EQ(aom_codec_control(enc.get(), AOME_SET_CPUUSED, cpu_used_),
            AOM_CODEC_OK);

  int frame_count = 0;
  ::libaom_test::RandomVideoSource video;
  video.Begin();
  constexpr int kNumFramesPerResolution = 2;
  for (const auto &frame_size : kFrameSizes) {
    cfg.g_w = frame_size.width;
    cfg.g_h = frame_size.height;
    if (cfg.g_w < 1 || cfg.g_w > 65536 || cfg.g_h < 1 || cfg.g_h > 65536) {
      EXPECT_EQ(aom_codec_enc_config_set(enc.get(), &cfg),
                AOM_CODEC_INVALID_PARAM);
      continue;
    }

    EXPECT_EQ(aom_codec_enc_config_set(enc.get(), &cfg), AOM_CODEC_OK);
    video.SetSize(cfg.g_w, cfg.g_h);

    aom_codec_iter_t iter;
    const aom_codec_cx_pkt_t *pkt;

    for (int i = 0; i < kNumFramesPerResolution; ++i) {
      video.Next();  // SetSize() does not call FillFrame().
      EXPECT_EQ(aom_codec_encode(enc.get(), video.img(), video.pts(),
                                 video.duration(), /*flags=*/0),
                AOM_CODEC_OK);

      iter = nullptr;
      while ((pkt = aom_codec_get_cx_data(enc.get(), &iter)) != nullptr) {
        ASSERT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
        // The frame following a resolution change should be a keyframe as the
        // change is too extreme to allow previous references to be used.
        if (i == 0 || usage_ == AOM_USAGE_ALL_INTRA) {
          EXPECT_NE(pkt->data.frame.flags & AOM_FRAME_IS_KEY, 0u)
              << "frame " << frame_count;
        }
        frame_count++;
      }
    }
  }

  EXPECT_EQ(frame_count, 2);
}